

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.h
# Opt level: O0

ssize_t __thiscall
wasm::LEB<long,_signed_char>::read
          (LEB<long,_signed_char> *this,int __fd,void *__buf,size_t __nbytes)

{
  ParseException *pPVar1;
  undefined4 in_register_00000034;
  ulong local_120;
  allocator<char> local_101;
  string local_100;
  long local_e0;
  size_t sext_bits;
  string local_d0;
  undefined1 local_aa;
  allocator<char> local_a9;
  string local_a8;
  undefined1 local_85;
  allocator<char> local_71;
  string local_70;
  ulong local_50;
  long unused_bits;
  long unused_bits_mask;
  long significant_payload;
  mask_type payload_mask;
  long payload;
  bool last;
  ulong uStack_20;
  char byte;
  long shift;
  function<signed_char_()> *get_local;
  LEB<long,_signed_char> *this_local;
  
  this->value = 0;
  uStack_20 = 0;
  shift = (long)CONCAT44(in_register_00000034,__fd);
  get_local = (function<signed_char_()> *)this;
  while( true ) {
    payload._7_1_ =
         std::function<signed_char_()>::operator()
                   ((function<signed_char_()> *)CONCAT44(in_register_00000034,__fd));
    payload._6_1_ = (((int)(char)payload._7_1_ & 0x80U) != 0 ^ 0xffU) & 1;
    payload_mask = (mask_type)(int)((int)(char)payload._7_1_ & 0x7f);
    if (uStack_20 == 0) {
      local_120 = 0xffffffffffffffff;
    }
    else {
      local_120 = (1L << (0x40 - (byte)uStack_20 & 0x3f)) - 1;
    }
    significant_payload = local_120;
    unused_bits_mask = local_120 & payload_mask;
    this->value = unused_bits_mask << ((byte)uStack_20 & 0x3f) | this->value;
    unused_bits = (local_120 ^ 0xffffffffffffffff) & 0x7f;
    local_50 = payload_mask & unused_bits;
    if (this->value < 0) {
      if (local_50 != unused_bits) {
        local_85 = 1;
        pPVar1 = (ParseException *)__cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_70,"Unused negative LEB bits must be 1s",&local_71);
        ParseException::ParseException(pPVar1,&local_70);
        local_85 = 0;
        __cxa_throw(pPVar1,&ParseException::typeinfo,ParseException::~ParseException);
      }
    }
    else if (local_50 != 0) {
      local_aa = 1;
      pPVar1 = (ParseException *)__cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8,"Unused non-negative LEB bits must be 0s",&local_a9);
      ParseException::ParseException(pPVar1,&local_a8);
      local_aa = 0;
      __cxa_throw(pPVar1,&ParseException::typeinfo,ParseException::~ParseException);
    }
    if (payload._6_1_ != 0) break;
    uStack_20 = uStack_20 + 7;
    if (0x3f < uStack_20) {
      sext_bits._6_1_ = 1;
      pPVar1 = (ParseException *)__cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d0,"LEB overflow",(allocator<char> *)((long)&sext_bits + 7));
      ParseException::ParseException(pPVar1,&local_d0);
      sext_bits._6_1_ = 0;
      __cxa_throw(pPVar1,&ParseException::typeinfo,ParseException::~ParseException);
    }
    payload._6_1_ = 0;
  }
  uStack_20 = uStack_20 + 7;
  if (((payload._7_1_ & 0x40) != 0) && (uStack_20 < 0x40)) {
    local_e0 = 0x40 - uStack_20;
    this->value = this->value << ((byte)local_e0 & 0x3f);
    this->value = this->value >> ((byte)local_e0 & 0x3f);
    if (-1 < this->value) {
      pPVar1 = (ParseException *)__cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_100," LEBsign-extend should produce a negative value",&local_101);
      ParseException::ParseException(pPVar1,&local_100);
      __cxa_throw(pPVar1,&ParseException::typeinfo,ParseException::~ParseException);
    }
  }
  return (ssize_t)this;
}

Assistant:

LEB<T, MiniT>& read(std::function<MiniT()> get) {
    value = 0;
    T shift = 0;
    MiniT byte;
    while (1) {
      byte = get();
      bool last = !(byte & 128);
      T payload = byte & 127;
      using mask_type = typename std::make_unsigned<T>::type;
      auto payload_mask = 0 == shift
                            ? ~mask_type(0)
                            : ((mask_type(1) << (sizeof(T) * 8 - shift)) - 1u);
      T significant_payload = payload_mask & payload;
      value |= significant_payload << shift;
      T unused_bits_mask = ~payload_mask & 127;
      T unused_bits = payload & unused_bits_mask;
      if (std::is_signed_v<T> && value < 0) {
        if (unused_bits != unused_bits_mask) {
          throw ParseException("Unused negative LEB bits must be 1s");
        }
      } else {
        if (unused_bits != 0) {
          throw ParseException("Unused non-negative LEB bits must be 0s");
        }
      }
      if (last) {
        break;
      }
      shift += 7;
      if (size_t(shift) >= sizeof(T) * 8) {
        throw ParseException("LEB overflow");
      }
    }
    // If signed LEB, then we might need to sign-extend.
    if constexpr (std::is_signed_v<T>) {
      shift += 7;
      if ((byte & 64) && size_t(shift) < 8 * sizeof(T)) {
        size_t sext_bits = 8 * sizeof(T) - size_t(shift);
        value <<= sext_bits;
        value >>= sext_bits;
        if (value >= 0) {
          throw ParseException(
            " LEBsign-extend should produce a negative value");
        }
      }
    }
    return *this;
  }